

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O1

char * __thiscall Potassco::ProgramOptions::Option::argName(Option *this)

{
  byte_t bVar1;
  Value *pVVar2;
  char *pcVar3;
  ValueDesc *pVVar4;
  char *pcVar5;
  
  pVVar2 = this->value_;
  bVar1 = pVVar2->descFlag_;
  if ((bVar1 == '\b') || (bVar1 == '\x01')) {
    if (bVar1 == '\x01') {
      pVVar4 = &pVVar2->desc_;
    }
    else {
      pVVar4 = (ValueDesc *)(pVVar2->desc_).pack;
    }
    pcVar5 = pVVar4->value;
  }
  else {
    pcVar5 = (char *)0x0;
  }
  pcVar3 = "<arg>";
  if ((~pVVar2->flags_ & 3) == 0) {
    pcVar3 = "";
  }
  if (pcVar5 != (char *)0x0) {
    pcVar3 = pcVar5;
  }
  return pcVar3;
}

Assistant:

const char*        argName()        const { return value_->arg(); }